

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_transaction.cpp
# Opt level: O0

int CfdAddTransactionOutput
              (void *handle,void *create_handle,int64_t value_satoshi,char *address,
              char *direct_locking_script,char *asset_string)

{
  Transaction *pTVar1;
  bool bVar2;
  undefined8 uVar3;
  char *in_RCX;
  int64_t in_RDX;
  long in_RSI;
  char *in_R8;
  char *in_R9;
  CfdException *except;
  exception *std_except;
  ConfidentialNonce nonce;
  ElementsConfidentialAddress confidential_addr;
  ElementsAddressFactory address_factory;
  ConfidentialAssetId asset;
  ConfidentialTransactionContext *tx_1;
  TransactionContext *tx;
  Amount amount;
  bool is_bitcoin;
  CfdCapiTransactionData *tx_data;
  ElementsConfidentialAddress *in_stack_fffffffffffff750;
  AddressFactory *in_stack_fffffffffffff758;
  ConfidentialTransaction *pCVar4;
  string *in_stack_fffffffffffff760;
  undefined8 in_stack_fffffffffffff768;
  CfdError error_code;
  allocator *paVar5;
  undefined7 in_stack_fffffffffffff770;
  undefined1 in_stack_fffffffffffff777;
  ElementsAddressFactory *in_stack_fffffffffffff780;
  bool *in_stack_fffffffffffff7a8;
  char *pcVar6;
  undefined8 in_stack_fffffffffffff7b0;
  int network_type;
  ConfidentialAssetId *in_stack_fffffffffffff810;
  Amount *in_stack_fffffffffffff818;
  undefined7 in_stack_fffffffffffff820;
  undefined1 in_stack_fffffffffffff827;
  string *in_stack_fffffffffffff858;
  void *in_stack_fffffffffffff860;
  Script local_780;
  ConfidentialNonce local_748;
  allocator local_719;
  string local_718 [32];
  undefined1 local_6f8 [383];
  allocator local_579;
  string local_578;
  ElementsConfidentialAddress local_558;
  allocator local_3a1;
  string local_3a0 [2];
  allocator local_351;
  string local_350;
  ConfidentialAssetId local_330;
  undefined1 local_302;
  allocator local_301;
  string local_300 [32];
  CfdSourceLocation local_2e0;
  ConfidentialTransaction *local_2c8;
  allocator local_2b9;
  string local_2b8;
  Script local_298;
  allocator local_259;
  string local_258;
  Address local_238;
  Transaction *local_c0;
  undefined1 local_b2;
  allocator local_b1;
  string local_b0 [32];
  Amount local_90;
  byte local_79;
  long local_78;
  allocator local_69;
  string local_68 [48];
  char *local_38;
  char *local_30;
  char *local_28;
  int64_t local_20;
  long local_18;
  
  error_code = (CfdError)((ulong)in_stack_fffffffffffff768 >> 0x20);
  network_type = (int)((ulong)in_stack_fffffffffffff7b0 >> 0x20);
  local_38 = in_R9;
  local_30 = in_R8;
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  cfd::Initialize();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_68,"TransactionData",&local_69);
  cfd::capi::CheckBuffer(in_stack_fffffffffffff860,in_stack_fffffffffffff858);
  std::__cxx11::string::~string(local_68);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  local_78 = local_18;
  local_79 = 0;
  cfd::capi::ConvertNetType(network_type,in_stack_fffffffffffff7a8);
  cfd::core::Amount::Amount(&local_90,local_20);
  if (*(long *)(local_78 + 0x18) == 0) {
    local_b2 = 1;
    uVar3 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_b0,"Invalid handle state. tx is null",&local_b1);
    cfd::core::CfdException::CfdException
              ((CfdException *)CONCAT17(in_stack_fffffffffffff777,in_stack_fffffffffffff770),
               error_code,in_stack_fffffffffffff760);
    local_b2 = 0;
    __cxa_throw(uVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if ((local_79 & 1) == 0) {
    local_2c8 = *(ConfidentialTransaction **)(local_78 + 0x18);
    bVar2 = cfd::capi::IsEmptyString(local_38);
    if (bVar2) {
      local_2e0.filename =
           strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_transaction.cpp"
                   ,0x2f);
      local_2e0.filename = local_2e0.filename + 1;
      local_2e0.line = 0x172;
      local_2e0.funcname = "CfdAddTransactionOutput";
      cfd::core::logger::warn<>(&local_2e0,"asset is null or empty.");
      local_302 = 1;
      uVar3 = __cxa_allocate_exception(0x30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_300,"Failed to parameter. asset is null or empty.",&local_301);
      cfd::core::CfdException::CfdException
                ((CfdException *)CONCAT17(in_stack_fffffffffffff777,in_stack_fffffffffffff770),
                 error_code,in_stack_fffffffffffff760);
      local_302 = 0;
      __cxa_throw(uVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_350,local_38,&local_351);
    cfd::core::ConfidentialAssetId::ConfidentialAssetId(&local_330,&local_350);
    std::__cxx11::string::~string((string *)&local_350);
    std::allocator<char>::~allocator((allocator<char> *)&local_351);
    bVar2 = cfd::capi::IsEmptyString(local_28);
    if (bVar2) {
      bVar2 = cfd::capi::IsEmptyString(local_30);
      if (bVar2) {
        cfd::ConfidentialTransactionContext::UpdateFeeAmount
                  ((ConfidentialTransactionContext *)
                   CONCAT17(in_stack_fffffffffffff827,in_stack_fffffffffffff820),
                   in_stack_fffffffffffff818,in_stack_fffffffffffff810);
      }
      else {
        cfd::core::ConfidentialNonce::ConfidentialNonce(&local_748);
        paVar5 = (allocator *)&stack0xfffffffffffff85f;
        pCVar4 = local_2c8;
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&stack0xfffffffffffff860,local_30,paVar5);
        cfd::core::Script::Script(&local_780,(string *)&stack0xfffffffffffff860);
        cfd::core::ConfidentialTransaction::AddTxOut
                  (pCVar4,&local_90,&local_330,&local_780,&local_748);
        cfd::core::Script::~Script((Script *)in_stack_fffffffffffff750);
        std::__cxx11::string::~string((string *)&stack0xfffffffffffff860);
        std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffff85f);
        cfd::core::ConfidentialNonce::~ConfidentialNonce((ConfidentialNonce *)0x607cf3);
      }
    }
    else {
      cfd::ElementsAddressFactory::ElementsAddressFactory(in_stack_fffffffffffff780);
      paVar5 = &local_3a1;
      pcVar6 = local_28;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)local_3a0,pcVar6,paVar5);
      bVar2 = cfd::core::ElementsConfidentialAddress::IsConfidentialAddress(local_3a0);
      std::__cxx11::string::~string((string *)local_3a0);
      std::allocator<char>::~allocator((allocator<char> *)&local_3a1);
      pCVar4 = local_2c8;
      if (bVar2) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_578,local_28,&local_579);
        cfd::core::ElementsConfidentialAddress::ElementsConfidentialAddress(&local_558,&local_578);
        std::__cxx11::string::~string((string *)&local_578);
        std::allocator<char>::~allocator((allocator<char> *)&local_579);
        (*(local_2c8->super_AbstractTransaction)._vptr_AbstractTransaction[0x13])
                  (local_2c8,&local_558,&local_90,&local_330,0);
        cfd::core::ElementsConfidentialAddress::~ElementsConfidentialAddress
                  (in_stack_fffffffffffff750);
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_718,local_28,&local_719);
        cfd::AddressFactory::GetAddress
                  (in_stack_fffffffffffff758,(string *)in_stack_fffffffffffff750);
        (*(pCVar4->super_AbstractTransaction)._vptr_AbstractTransaction[0x12])
                  (pCVar4,local_6f8,&local_90,&local_330);
        cfd::core::Address::~Address(&in_stack_fffffffffffff750->unblinded_address_);
        std::__cxx11::string::~string(local_718);
        std::allocator<char>::~allocator((allocator<char> *)&local_719);
      }
      cfd::ElementsAddressFactory::~ElementsAddressFactory((ElementsAddressFactory *)0x607bf0);
    }
    cfd::core::ConfidentialAssetId::~ConfidentialAssetId((ConfidentialAssetId *)0x607d9e);
  }
  else {
    local_c0 = *(Transaction **)(local_78 + 0x18);
    bVar2 = cfd::capi::IsEmptyString(local_28);
    pTVar1 = local_c0;
    if (bVar2) {
      bVar2 = cfd::capi::IsEmptyString(local_30);
      pTVar1 = local_c0;
      if (!bVar2) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_2b8,local_30,&local_2b9);
        cfd::core::Script::Script(&local_298,&local_2b8);
        cfd::core::Transaction::AddTxOut(pTVar1,&local_90,&local_298);
        cfd::core::Script::~Script((Script *)in_stack_fffffffffffff750);
        std::__cxx11::string::~string((string *)&local_2b8);
        std::allocator<char>::~allocator((allocator<char> *)&local_2b9);
      }
    }
    else {
      paVar5 = &local_259;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_258,local_28,paVar5);
      cfd::core::Address::Address(&local_238,&local_258);
      (*(pTVar1->super_AbstractTransaction)._vptr_AbstractTransaction[0x12])
                (pTVar1,&local_238,&local_90);
      cfd::core::Address::~Address(&in_stack_fffffffffffff750->unblinded_address_);
      std::__cxx11::string::~string((string *)&local_258);
      std::allocator<char>::~allocator((allocator<char> *)&local_259);
    }
  }
  return 0;
}

Assistant:

int CfdAddTransactionOutput(
    void* handle, void* create_handle, int64_t value_satoshi,
    const char* address, const char* direct_locking_script,
    const char* asset_string) {
  try {
    cfd::Initialize();
    CheckBuffer(create_handle, kPrefixTransactionData);
    CfdCapiTransactionData* tx_data =
        static_cast<CfdCapiTransactionData*>(create_handle);

    bool is_bitcoin = false;
    ConvertNetType(tx_data->net_type, &is_bitcoin);
    Amount amount = Amount(value_satoshi);
    if (tx_data->tx_obj == nullptr) {
      throw CfdException(
          CfdError::kCfdIllegalStateError, "Invalid handle state. tx is null");
    } else if (is_bitcoin) {
      TransactionContext* tx =
          static_cast<TransactionContext*>(tx_data->tx_obj);
      if (!IsEmptyString(address)) {
        tx->AddTxOut(Address(address), amount);
      } else if (!IsEmptyString(direct_locking_script)) {
        tx->AddTxOut(amount, Script(direct_locking_script));
      }
    } else {
#ifndef CFD_DISABLE_ELEMENTS
      ConfidentialTransactionContext* tx =
          static_cast<ConfidentialTransactionContext*>(tx_data->tx_obj);
      if (IsEmptyString(asset_string)) {
        warn(CFD_LOG_SOURCE, "asset is null or empty.");
        throw CfdException(
            CfdError::kCfdIllegalArgumentError,
            "Failed to parameter. asset is null or empty.");
      }
      ConfidentialAssetId asset = ConfidentialAssetId(asset_string);

      if (!IsEmptyString(address)) {
        ElementsAddressFactory address_factory;
        if (ElementsConfidentialAddress::IsConfidentialAddress(address)) {
          ElementsConfidentialAddress confidential_addr(address);
          tx->AddTxOut(confidential_addr, amount, asset, false);
        } else {
          tx->AddTxOut(address_factory.GetAddress(address), amount, asset);
        }
      } else if (!IsEmptyString(direct_locking_script)) {
        ConfidentialNonce nonce;
        tx->AddTxOut(amount, asset, Script(direct_locking_script), nonce);
      } else {
        tx->UpdateFeeAmount(amount, asset);
      }
#else
      throw CfdException(
          CfdError::kCfdIllegalArgumentError, "Elements is not supported.");
#endif  // CFD_DISABLE_ELEMENTS
    }

    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    return SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
    return CfdErrorCode::kCfdUnknownError;
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
    return CfdErrorCode::kCfdUnknownError;
  }
}